

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader_factory.cc
# Opt level: O2

bool draco::FileReaderFactory::RegisterReader(OpenFunction open_function)

{
  pointer pp_Var1;
  pointer pp_Var2;
  vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *this;
  long in_RDI;
  bool bVar3;
  value_type local_18;
  
  if (in_RDI == 0) {
    bVar3 = false;
  }
  else {
    this = (anonymous_namespace)::GetFileReaderOpenFunctions_abi_cxx11_();
    pp_Var1 = (this->
              super__Vector_base<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pp_Var2 = (this->
              super__Vector_base<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::push_back(this,&local_18);
    bVar3 = (long)(this->
                  super__Vector_base<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->
                  super__Vector_base<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3 ==
            ((long)pp_Var1 - (long)pp_Var2 >> 3) + 1;
  }
  return bVar3;
}

Assistant:

bool FileReaderFactory::RegisterReader(OpenFunction open_function) {
  if (open_function == nullptr) {
    return false;
  }
  auto open_functions = GetFileReaderOpenFunctions();
  const size_t num_readers = open_functions->size();
  open_functions->push_back(open_function);
  return open_functions->size() == num_readers + 1;
}